

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> * __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this,
          vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *other)

{
  size_t sVar1;
  Half *pHVar2;
  Half *pHVar3;
  size_t sVar4;
  
  if (this != other) {
    if ((this->alloc).memoryResource == (other->alloc).memoryResource) {
      pHVar2 = this->ptr;
      this->ptr = other->ptr;
      other->ptr = pHVar2;
      sVar1 = this->nAlloc;
      this->nAlloc = other->nAlloc;
      other->nAlloc = sVar1;
      sVar1 = this->nStored;
      this->nStored = other->nStored;
      other->nStored = sVar1;
    }
    else {
      this->nStored = 0;
      reserve(this,other->nStored);
      sVar1 = other->nStored;
      if (sVar1 != 0) {
        pHVar2 = this->ptr;
        pHVar3 = other->ptr;
        sVar4 = 0;
        do {
          pHVar2[sVar4].h = pHVar3[sVar4].h;
          sVar4 = sVar4 + 1;
        } while (sVar1 != sVar4);
      }
      this->nStored = sVar1;
    }
  }
  return this;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }